

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::AddVisibilityPresetFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  pointer pcVar1;
  cmake *this_00;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  TargetType TVar4;
  PolicyStatus PVar5;
  int iVar6;
  long *plVar7;
  cmValue cVar8;
  cmValue __rhs;
  undefined8 *puVar9;
  ostream *poVar10;
  string *psVar11;
  cmLocalGenerator *pcVar12;
  size_type *psVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  PolicyID id;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar15;
  string compileOption;
  string flagDefine;
  string warnCMP0063;
  ostringstream e;
  cmGeneratorTarget *local_240;
  string local_238;
  char **local_218;
  undefined1 local_210 [32];
  _Alloc_hider local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  char *local_1c8;
  _Base_ptr local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Base_ptr local_188;
  _Base_ptr local_180;
  size_t local_178;
  char *local_170;
  _Rb_tree_node_base local_168;
  ios_base local_138 [264];
  
  if (lang->_M_string_length == 0) {
    return;
  }
  local_1c8 = &local_1b8;
  local_1c0 = (_Base_ptr)0x0;
  local_1b8 = '\0';
  local_240 = target;
  local_1f0._M_p = (pointer)flags;
  TVar4 = cmGeneratorTarget::GetType(target);
  if (((TVar4 == SHARED_LIBRARY) ||
      (TVar4 = cmGeneratorTarget::GetType(local_240), TVar4 == MODULE_LIBRARY)) ||
     (bVar3 = cmGeneratorTarget::IsExecutableWithExports(local_240), bVar3)) {
LAB_001c1a1f:
    local_218 = (char **)0x0;
  }
  else {
    PVar5 = cmPolicies::PolicyMap::Get(&local_240->PolicyMap,CMP0063);
    if (PVar5 == OLD) goto LAB_001c2122;
    if (PVar5 != WARN) goto LAB_001c1a1f;
    local_218 = &local_1c8;
  }
  pcVar2 = local_240;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 "CMAKE_",lang);
  plVar7 = (long *)std::__cxx11::string::append(local_1a8);
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  psVar13 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_238.field_2._M_allocated_capacity = *psVar13;
    local_238.field_2._8_8_ = plVar7[3];
  }
  else {
    local_238.field_2._M_allocated_capacity = *psVar13;
    local_238._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_238._M_string_length = plVar7[1];
  *plVar7 = (long)psVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._M_allocated_capacity + 1));
  }
  cVar8 = cmMakefile::GetDefinition(this->Makefile,&local_238);
  if (cVar8.Value != (string *)0x0) {
    local_210._0_8_ = local_210 + 0x10;
    pcVar1 = (lang->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_210,pcVar1,pcVar1 + lang->_M_string_length);
    std::__cxx11::string::append(local_210);
    __rhs = cmGeneratorTarget::GetProperty(pcVar2,(string *)local_210);
    if (__rhs.Value != (string *)0x0) {
      if (local_218 == (char **)0x0) {
        iVar6 = std::__cxx11::string::compare((char *)__rhs.Value);
        if (((iVar6 == 0) ||
            (iVar6 = std::__cxx11::string::compare((char *)__rhs.Value), iVar6 == 0)) ||
           ((iVar6 = std::__cxx11::string::compare((char *)__rhs.Value), iVar6 == 0 ||
            (iVar6 = std::__cxx11::string::compare((char *)__rhs.Value), iVar6 == 0)))) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,cVar8.Value,__rhs.Value);
          (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])
                    (this,local_1f0._M_p,local_1a8);
          local_1e8.field_2._M_allocated_capacity = local_198._M_allocated_capacity;
          local_1e8._M_dataplus._M_p = (pointer)local_1a8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._0_8_ != &local_198) goto LAB_001c1d9c;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target ",7);
          psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar2);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar11->_M_dataplus)._M_p,
                               psVar11->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," uses unsupported value \"",0x19);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,((__rhs.Value)->_M_dataplus)._M_p,
                               (__rhs.Value)->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" for ",6);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,(char *)local_210._0_8_,local_210._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," The supported values are: default, hidden, protected, and internal.",
                     0x44);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,
                            (ulong)(local_1e8.field_2._M_allocated_capacity + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      else {
        std::operator+(&local_1e8,"  ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_210);
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e8);
        paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar14) {
          local_198._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_198._8_8_ = puVar9[3];
          local_1a8._0_8_ = &local_198;
        }
        else {
          local_198._M_allocated_capacity = paVar14->_M_allocated_capacity;
          local_1a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar9;
        }
        local_1a8._8_8_ = puVar9[1];
        *puVar9 = paVar14;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_218,local_1a8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
LAB_001c1d9c:
          operator_delete(local_1e8._M_dataplus._M_p,
                          (ulong)(local_1e8.field_2._M_allocated_capacity + 1));
        }
      }
    }
    if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  iVar6 = std::__cxx11::string::compare((char *)lang);
  if ((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)lang), iVar6 == 0)) {
    pcVar2 = local_240;
    local_188 = (_Base_ptr)(lang->_M_dataplus)._M_p;
    local_198._8_8_ = lang->_M_string_length;
    local_1a8._0_8_ = &DAT_00000006;
    local_1a8._8_8_ = "CMAKE_";
    local_198._M_allocated_capacity = 0;
    local_180 = (_Base_ptr)0x0;
    local_178 = 0x2a;
    local_170 = "_COMPILE_OPTIONS_VISIBILITY_INLINES_HIDDEN";
    local_168._M_color = _S_red;
    local_168._4_4_ = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_1a8;
    cmCatViews(&local_238,views);
    cVar8 = cmMakefile::GetDefinition(this->Makefile,&local_238);
    if (cVar8.Value != (string *)0x0) {
      local_210._0_8_ = &DAT_00000019;
      local_1a8._0_8_ = &local_198;
      local_1a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)local_210);
      local_198._M_allocated_capacity = local_210._0_8_;
      *(char *)(local_1a8._0_8_ + 9) = 'Y';
      *(char *)(local_1a8._0_8_ + 10) = '_';
      *(char *)(local_1a8._0_8_ + 0xb) = 'I';
      *(char *)(local_1a8._0_8_ + 0xc) = 'N';
      *(char *)(local_1a8._0_8_ + 0xd) = 'L';
      *(char *)(local_1a8._0_8_ + 0xe) = 'I';
      *(char *)(local_1a8._0_8_ + 0xf) = 'N';
      *(char *)(local_1a8._0_8_ + 0x10) = 'E';
      *(char *)(local_1a8._0_8_ + 0x11) = 'S';
      *(char *)(local_1a8._0_8_ + 0x12) = '_';
      *(char *)(local_1a8._0_8_ + 0x13) = 'H';
      *(char *)(local_1a8._0_8_ + 0x14) = 'I';
      *(char *)(local_1a8._0_8_ + 0x15) = 'D';
      *(char *)(local_1a8._0_8_ + 0x16) = 'D';
      *(char *)(local_1a8._0_8_ + 0x17) = 'E';
      *(char *)(local_1a8._0_8_ + 0x18) = 'N';
      *(undefined8 *)local_1a8._0_8_ = 0x494c494249534956;
      *(char *)(local_1a8._0_8_ + 8) = 'T';
      *(char *)(local_1a8._0_8_ + 9) = 'Y';
      *(char *)(local_1a8._0_8_ + 10) = '_';
      *(char *)(local_1a8._0_8_ + 0xb) = 'I';
      *(char *)(local_1a8._0_8_ + 0xc) = 'N';
      *(char *)(local_1a8._0_8_ + 0xd) = 'L';
      *(char *)(local_1a8._0_8_ + 0xe) = 'I';
      *(char *)(local_1a8._0_8_ + 0xf) = 'N';
      local_1a8._8_8_ = local_210._0_8_;
      *(char *)(local_1a8._0_8_ + local_210._0_8_) = '\0';
      bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._M_allocated_capacity + 1));
      }
      if (bVar3) {
        if (local_218 == (char **)0x0) {
          (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])
                    (this,local_1f0._M_p,cVar8.Value);
        }
        else {
          std::__cxx11::string::append((char *)local_218);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_1c0 != (_Base_ptr)0x0) &&
     (pVar15 = std::
               _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
               ::_M_insert_unique<cmGeneratorTarget_const*const&>
                         ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                           *)&this->WarnCMP0063,&local_240),
     ((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_238,(cmPolicies *)0x3f,id);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\nTarget \"",9);
    psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(local_240);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" of type \"",0xb);
    TVar4 = cmGeneratorTarget::GetType(local_240);
    psVar11 = cmState::GetTargetTypeName_abi_cxx11_(TVar4);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\" has the following visibility properties set for ",0x32);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,":\n",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_1c8,(long)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"For compatibility CMake is not honoring them for this target.",0x3d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    pcVar12 = cmGeneratorTarget::GetLocalGenerator(local_240);
    this_00 = pcVar12->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_210);
    cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_238,(cmListFileBacktrace *)local_210);
    if ((cmMakefile *)local_210._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
LAB_001c2122:
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddVisibilityPresetFlags(
  std::string& flags, cmGeneratorTarget const* target, const std::string& lang)
{
  if (lang.empty()) {
    return;
  }

  std::string warnCMP0063;
  std::string* pWarnCMP0063 = nullptr;
  if (target->GetType() != cmStateEnums::SHARED_LIBRARY &&
      target->GetType() != cmStateEnums::MODULE_LIBRARY &&
      !target->IsExecutableWithExports()) {
    switch (target->GetPolicyStatusCMP0063()) {
      case cmPolicies::OLD:
        return;
      case cmPolicies::WARN:
        pWarnCMP0063 = &warnCMP0063;
        break;
      default:
        break;
    }
  }

  AddVisibilityCompileOption(flags, target, this, lang, pWarnCMP0063);

  if (lang == "CXX" || lang == "OBJCXX") {
    AddInlineVisibilityCompileOption(flags, target, this, pWarnCMP0063, lang);
  }

  if (!warnCMP0063.empty() && this->WarnCMP0063.insert(target).second) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0063) << "\n"
      "Target \"" << target->GetName() << "\" of "
      "type \"" << cmState::GetTargetTypeName(target->GetType()) << "\" "
      "has the following visibility properties set for " << lang << ":\n" <<
      warnCMP0063 <<
      "For compatibility CMake is not honoring them for this target.";
    /* clang-format on */
    target->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING, w.str(), target->GetBacktrace());
  }
}